

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

ssize_t __thiscall
QSocks5SocketEngine::write(QSocks5SocketEngine *this,int __fd,void *__buf,size_t __n)

{
  QSocks5SocketEnginePrivate *pQVar1;
  Promoted<long_long,_int> PVar2;
  long lVar3;
  char *pcVar4;
  undefined4 in_register_00000034;
  QHostAddress *dstAddr;
  long in_FS_OFFSET;
  qint64 written;
  QSocks5SocketEnginePrivate *d;
  QByteArray sealedBuf;
  QByteArray buf;
  QByteArray *in_stack_ffffffffffffff28;
  QIpPacketHeader *in_stack_ffffffffffffff30;
  qsizetype in_stack_ffffffffffffff40;
  QIpPacketHeader *pQVar5;
  char *in_stack_ffffffffffffff48;
  QTcpSocket *pQVar6;
  QIpPacketHeader *local_70;
  QByteArray local_68;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  QIpPacketHeader *local_38;
  undefined1 local_30 [40];
  long local_8;
  
  dstAddr = (QHostAddress *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QIpPacketHeader *)__buf;
  pQVar1 = d_func((QSocks5SocketEngine *)0x373f9d);
  if (pQVar1->mode == ConnectMode) {
    PVar2 = qMin<long_long,int>((longlong *)&local_38,&MaxWriteBufferSize);
    lVar3 = (**(code **)(*(long *)&pQVar1->data->controlSocket->super_QAbstractSocket + 0xa8))();
    local_38 = (QIpPacketHeader *)(PVar2 - lVar3);
    if ((long)local_38 < 1) {
      local_70 = (QIpPacketHeader *)0x0;
    }
    else {
      local_50 = 0xaaaaaaaaaaaaaaaa;
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      QByteArray::fromRawData(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_68.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_68.d.size = -0x5555555555555556;
      QByteArray::QByteArray((QByteArray *)0x374089);
      QSocks5Authenticator::seal
                ((QSocks5Authenticator *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (QByteArray *)0x3740ab);
      pQVar6 = pQVar1->data->controlSocket;
      pcVar4 = QByteArray::constData((QByteArray *)0x3740cf);
      QByteArray::size(&local_68);
      local_70 = (QIpPacketHeader *)QIODevice::write((char *)pQVar6,(longlong)pcVar4);
      if (0 < (long)local_70) {
        pQVar6 = pQVar1->data->controlSocket;
        (**(code **)(*(long *)&pQVar6->super_QAbstractSocket + 0xc0))(pQVar6,0);
        local_70 = local_38;
      }
      QByteArray::~QByteArray((QByteArray *)0x37414a);
      QByteArray::~QByteArray((QByteArray *)0x374157);
    }
  }
  else if (pQVar1->mode == UdpAssociateMode) {
    pQVar5 = local_38;
    QIpPacketHeader::QIpPacketHeader
              (local_38,dstAddr,(quint16)((ulong)in_stack_ffffffffffffff30 >> 0x30));
    local_70 = (QIpPacketHeader *)(**(code **)(*(long *)this + 0x100))(this,dstAddr,pQVar5,local_30)
    ;
    QIpPacketHeader::~QIpPacketHeader(in_stack_ffffffffffffff30);
  }
  else {
    local_70 = (QIpPacketHeader *)0xffffffffffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (ssize_t)local_70;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QSocks5SocketEngine::write(const char *data, qint64 len)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_Q_DEBUG << "write" << dump(QByteArray(data, len));

    if (d->mode == QSocks5SocketEnginePrivate::ConnectMode) {
        // clamp down the amount of bytes to transfer at once
        len = qMin<qint64>(len, MaxWriteBufferSize) - d->data->controlSocket->bytesToWrite();
        if (len <= 0)
            return 0;

        QByteArray buf = QByteArray::fromRawData(data, len);
        QByteArray sealedBuf;
        if (!d->data->authenticator->seal(buf, &sealedBuf)) {
            // ### Handle this error.
        }
        // We pass pointer and size because 'sealedBuf' is (most definitely) raw data:
        // QIODevice might have to cache the byte array if the socket cannot write the data.
        // If the _whole_ array needs to be cached then it would simply store a copy of the
        // array whose data will go out of scope and be deallocated before it can be used.
        qint64 written = d->data->controlSocket->write(sealedBuf.constData(), sealedBuf.size());

        if (written <= 0) {
            QSOCKS5_Q_DEBUG << "native write returned" << written;
            return written;
        }
        d->data->controlSocket->waitForBytesWritten(0);
        //NB: returning len rather than written for the OK case, because the "sealing" may increase the length
        return len;
#ifndef QT_NO_UDPSOCKET
    } else if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        // send to connected address
        return writeDatagram(data, len, QIpPacketHeader(d->peerAddress, d->peerPort));
#endif
    }
    //### set an error ???
    return -1;
}